

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall
wasm::FunctionValidator::visitCallIndirect(FunctionValidator *this,CallIndirect *curr)

{
  bool result;
  Table *pTVar1;
  
  validateReturnCall<wasm::CallIndirect>(this,curr);
  ValidationInfo::shouldBeEqualOrFirstIsUnreachable<wasm::CallIndirect*,wasm::Type>
            (this->info,(Type)(curr->target->type).id,(Type)0x2,curr,
             "indirect call target must be an i32",
             (this->
             super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
             ).
             super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
             .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
             currFunction);
  if ((curr->target->type).id != 1) {
    pTVar1 = Module::getTableOrNull
                       ((this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currModule,(Name)(curr->table).super_IString.str);
    ValidationInfo::shouldBeTrue<wasm::CallIndirect*>
              (this->info,pTVar1 != (Table *)0x0,curr,"call-indirect table must exist",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
    if (pTVar1 != (Table *)0x0) {
      result = wasm::Type::isFunction(&pTVar1->type);
      ValidationInfo::shouldBeTrue<wasm::CallIndirect*>
                (this->info,result,curr,"call-indirect table must be of function type.",
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                 ).
                 super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .
                 super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                 .currFunction);
    }
  }
  validateCallParamsAndResult<wasm::CallIndirect>
            (this,curr,(HeapType)(curr->heapType).id,(Expression *)curr);
  return;
}

Assistant:

void FunctionValidator::visitCallIndirect(CallIndirect* curr) {
  validateReturnCall(curr);
  shouldBeEqualOrFirstIsUnreachable(curr->target->type,
                                    Type(Type::i32),
                                    curr,
                                    "indirect call target must be an i32");

  if (curr->target->type != Type::unreachable) {
    auto* table = getModule()->getTableOrNull(curr->table);
    shouldBeTrue(!!table, curr, "call-indirect table must exist");
    if (table) {
      shouldBeTrue(table->type.isFunction(),
                   curr,
                   "call-indirect table must be of function type.");
    }
  }

  validateCallParamsAndResult(curr, curr->heapType);
}